

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O0

void linux_libkqueue_free(void)

{
  int ret;
  void *retval;
  pid_t tid;
  void *local_10;
  pid_t local_4;
  
  pthread_mutex_lock((pthread_mutex_t *)&kq_mtx);
  local_4 = monitoring_tid;
  if (monitoring_tid == 0) {
    pthread_mutex_unlock((pthread_mutex_t *)&kq_mtx);
  }
  else {
    pthread_cancel(monitoring_thread);
    pthread_mutex_unlock((pthread_mutex_t *)&kq_mtx);
    pthread_join(monitoring_thread,&local_10);
  }
  return;
}

Assistant:

static void
linux_libkqueue_free(void)
{
    pid_t tid;

    tracing_mutex_lock(&kq_mtx);
    tid = monitoring_tid; /* Gets trashed when the thread exits */
    if (tid) {
        void *retval;
        int ret;

        dbg_printf("tid=%u - cancelling", tid);
        ret = pthread_cancel(monitoring_thread);
        if (ret != 0)
           dbg_printf("tid=%u - cancel failed: %s", tid, strerror(ret));
        /*
         * We unlock here to allow the monitoring thread
         * to continue if it was processing a cleanup.
         */
        tracing_mutex_unlock(&kq_mtx);

        ret = pthread_join(monitoring_thread, &retval);
        if (ret == 0) {
            if (retval == PTHREAD_CANCELED) {
                dbg_printf("tid=%u - joined with exit_status=PTHREAD_CANCELED", tid);
            } else {
                dbg_printf("tid=%u - joined with exit_status=%" PRIdPTR, tid, (intptr_t)retval);
            }
        } else {
            dbg_printf("tid=%u - join failed: %s", tid, strerror(ret));
        }
    }
    else
        tracing_mutex_unlock(&kq_mtx);
}